

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O0

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenStringEscapeCode(Lexer *this)

{
  int iVar1;
  Lexer *in_RSI;
  Position local_c0;
  undefined1 local_a8 [40];
  Position local_80;
  undefined1 local_68 [40];
  Position local_40;
  Position local_28;
  Lexer *this_local;
  
  this_local = this;
  nextChar(in_RSI);
  switch(in_RSI->currentChar) {
  case 0x22:
  case 0x27:
  case 0x5c:
  case 0x61:
  case 0x62:
  case 0x66:
  case 0x6e:
  case 0x72:
  case 0x74:
  case 0x76:
    std::unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>>::
    unique_ptr<std::default_delete<pfederc::Token>,void>
              ((unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>> *)this,(nullptr_t)0x0
              );
    break;
  default:
    local_a8._6_2_ = 2;
    local_a8._0_4_ = 3;
    getCurrentCursor(&local_c0,in_RSI);
    std::
    make_unique<pfederc::Error<pfederc::LexerErrorCode>,pfederc::Level,pfederc::LexerErrorCode,pfederc::Position>
              ((Level *)(local_a8 + 8),(LexerErrorCode *)(local_a8 + 6),(Position *)local_a8);
    generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                        *)in_RSI);
    std::
    unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                   *)(local_a8 + 8));
    break;
  case 0x78:
    nextChar(in_RSI);
    iVar1 = isxdigit(in_RSI->currentChar);
    if (iVar1 == 0) {
      local_28.line._6_2_ = 2;
      local_28.line._0_4_ = 6;
      getCurrentCursor((Position *)(local_68 + 0x10),in_RSI);
      Position::Position(&local_40,local_68._16_8_,in_RSI->currentEndIndex,in_RSI->currentEndIndex);
      std::
      make_unique<pfederc::Error<pfederc::LexerErrorCode>,pfederc::Level,pfederc::LexerErrorCode,pfederc::Position>
                ((Level *)&local_28.startIndex,(LexerErrorCode *)((long)&local_28.line + 6),
                 &local_28);
      generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                          *)in_RSI);
      std::
      unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                     *)&local_28.startIndex);
    }
    else {
      nextChar(in_RSI);
      iVar1 = isxdigit(in_RSI->currentChar);
      if (iVar1 == 0) {
        local_68._6_2_ = 2;
        local_68._0_4_ = 6;
        getCurrentCursor((Position *)(local_a8 + 0x10),in_RSI);
        Position::Position(&local_80,local_a8._16_8_,in_RSI->currentEndIndex,in_RSI->currentEndIndex
                          );
        std::
        make_unique<pfederc::Error<pfederc::LexerErrorCode>,pfederc::Level,pfederc::LexerErrorCode,pfederc::Position>
                  ((Level *)(local_68 + 8),(LexerErrorCode *)(local_68 + 6),(Position *)local_68);
        generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                            *)in_RSI);
        std::
        unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
        ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                       *)(local_68 + 8));
      }
      else {
        std::unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>>::
        unique_ptr<std::default_delete<pfederc::Token>,void>
                  ((unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>> *)this,
                   (nullptr_t)0x0);
      }
    }
  }
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenStringEscapeCode() noexcept {
  nextChar(); // eat '\'
  switch (currentChar) {
  case '\'':
  case '\"':
  case '\\':
  case 'a':
  case 'b':
  case 'f':
  case 'n':
  case 'r':
  case 't':
  case 'v':
    return nullptr;
  case 'x':
    nextChar(); // eat x
    if (!std::isxdigit(currentChar)) {
      return generateError(std::make_unique<LexerError>(LVL_ERROR,
        LexerErrorCode::LEX_ERR_STR_HEXADECIMAL_CHAR, Position{getCurrentCursor().line,
          currentEndIndex, currentEndIndex}));
    }
    nextChar(); // eat hex
    if (!std::isxdigit(currentChar)) {
      return generateError(std::make_unique<LexerError>(LVL_ERROR,
        LexerErrorCode::LEX_ERR_STR_HEXADECIMAL_CHAR, Position{getCurrentCursor().line,
          currentEndIndex, currentEndIndex}));
    }
    return nullptr;
  default:
    return generateError(std::make_unique<LexerError>(LVL_ERROR,
      LexerErrorCode::LEX_ERR_STR_INVALID_ESCAPE_CODE, getCurrentCursor()));
  }
}